

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O1

AppendResult __thiscall
metaf::WindGroup::appendPeakWind(WindGroup *this,string *group,ReportMetadata *reportMetadata)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __s;
  WindGroup *pWVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  int *piVar6;
  undefined8 uVar7;
  ulong uVar8;
  long lVar9;
  AppendResult AVar10;
  char cVar12;
  _Alloc_hider _Var13;
  Direction unaff_R13;
  char **__endptr;
  smatch match;
  string_type local_c8;
  WindGroup *local_a8;
  string_type local_a0;
  ulong local_80;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_78;
  char *local_58;
  string_type local_50;
  size_type sVar11;
  
  if ((appendPeakWind(std::__cxx11::string_const&,metaf::ReportMetadata_const&)::pkWndRgx_abi_cxx11_
       == '\0') &&
     (iVar3 = __cxa_guard_acquire(&appendPeakWind(std::__cxx11::string_const&,metaf::ReportMetadata_const&)
                                   ::pkWndRgx_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&appendPeakWind(std::__cxx11::string_const&,metaf::ReportMetadata_const&)::
                pkWndRgx_abi_cxx11_,"(\\d\\d0)([1-9]?\\d\\d)/(\\d\\d)?(\\d\\d)",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &appendPeakWind(std::__cxx11::string_const&,metaf::ReportMetadata_const&)::
                  pkWndRgx_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&appendPeakWind(std::__cxx11::string_const&,metaf::ReportMetadata_const&)::
                         pkWndRgx_abi_cxx11_);
  }
  local_78.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._M_begin._M_current = (char *)0x0;
  local_78.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __s._M_current = (group->_M_dataplus)._M_p;
  bVar2 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    (__s,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(__s._M_current + group->_M_string_length),&local_78,
                     &appendPeakWind(std::__cxx11::string_const&,metaf::ReportMetadata_const&)::
                      pkWndRgx_abi_cxx11_,0);
  sVar11 = 2;
  AVar10 = GROUP_INVALIDATED;
  if (!bVar2) goto LAB_001a72e2;
  this->windType = PEAK_WIND;
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::str(&local_c8,&local_78,1);
  if (local_c8._M_string_length != 3) goto LAB_001a7025;
  iVar3 = std::__cxx11::string::compare((char *)&local_c8);
  bVar2 = true;
  if (iVar3 == 0) {
    unaff_R13.dirDegrees = 0;
    unaff_R13.dirType = NOT_REPORTED;
  }
  else {
    unaff_R13.dirDegrees = 0;
    unaff_R13.dirType = VARIABLE;
    iVar3 = std::__cxx11::string::compare((char *)&local_c8);
    if (iVar3 != 0) {
      if (local_c8._M_dataplus._M_p[2] == '0') {
        uVar8 = 0;
        if (2 < local_c8._M_string_length) {
          lVar9 = 0;
          do {
            if ((byte)(local_c8._M_dataplus._M_p[lVar9] - 0x3aU) < 0xf6) {
              uVar4 = 0;
              uVar8 = 0;
              goto LAB_001a7017;
            }
            uVar4 = (uint)(byte)(local_c8._M_dataplus._M_p[lVar9] - 0x30) + (int)uVar8 * 10;
            uVar8 = (ulong)uVar4;
            lVar9 = lVar9 + 1;
          } while ((int)lVar9 != 3);
          uVar8 = 0x100000000;
LAB_001a7017:
          uVar8 = uVar4 | uVar8;
        }
        if ((uVar8 & 0x100000000) != 0) {
          unaff_R13 = (Direction)(uVar8 | 0x300000000);
          goto LAB_001a7028;
        }
      }
LAB_001a7025:
      bVar2 = false;
    }
  }
LAB_001a7028:
  paVar5 = &local_c8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar5) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (!bVar2) goto LAB_001a72e2;
  this->windDir = unaff_R13;
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::str(&local_c8,&local_78,2);
  local_a8 = this;
  if ((local_c8._M_string_length == 0) ||
     (iVar3 = std::__cxx11::string::compare((char *)&local_c8), iVar3 == 0)) {
    _Var13._M_p = (char *)0x0;
LAB_001a70b9:
    __endptr = (char **)0x0;
  }
  else {
    _Var13._M_p = (char *)0x1;
    __endptr = (char **)0x0;
    if (local_c8._M_string_length == 2) {
LAB_001a7312:
      bVar2 = true;
      uVar8 = 0;
      do {
        if ((byte)(local_c8._M_dataplus._M_p[uVar8] - 0x3aU) < 0xf6) {
          __endptr = (char **)0x0;
          bVar2 = false;
          break;
        }
        __endptr = (char **)(ulong)((uint)(byte)(local_c8._M_dataplus._M_p[uVar8] - 0x30) +
                                   (int)__endptr * 10);
        uVar8 = uVar8 + 1;
      } while ((uVar8 & 0xffffffff) < local_c8._M_string_length);
      if (bVar2) {
        uVar8 = 0x100000000;
        cVar12 = '\0';
        AVar10 = GROUP_INVALIDATED;
        goto LAB_001a70bf;
      }
      goto LAB_001a70b9;
    }
    if (local_c8._M_string_length == 3) {
      if (*local_c8._M_dataplus._M_p == '0') goto LAB_001a70b9;
      goto LAB_001a7312;
    }
  }
  while( true ) {
    cVar12 = (char)_Var13._M_p;
    uVar8 = 0;
    AVar10 = (AppendResult)sVar11;
LAB_001a70bf:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar5) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if (cVar12 != '\0') goto LAB_001a72e2;
    (local_a8->wSpeed).speedValue.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int> =
         (_Optional_payload_base<unsigned_int>)(uVar8 | (ulong)__endptr);
    (local_a8->wSpeed).speedUnit = KNOTS;
    if ((reportMetadata->reportTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::MetafTime>._M_engaged == false) {
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str(&local_c8,&local_78,3);
      bVar2 = local_c8._M_string_length == 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar5) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      bVar2 = false;
    }
    if (bVar2) goto LAB_001a72e2;
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_a0,&local_78,3);
    sVar11 = local_a0._M_string_length;
    if (local_a0._M_string_length == 0) break;
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_50,&local_78,3);
    _Var13._M_p = local_50._M_dataplus._M_p;
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)__errno_location();
    uVar4 = *(uint *)paVar5;
    reportMetadata = (ReportMetadata *)(ulong)uVar4;
    *(uint *)paVar5 = 0;
    __endptr = &local_58;
    uVar8 = strtoul(_Var13._M_p,__endptr,10);
    if (local_58 == _Var13._M_p) goto LAB_001a73e2;
    if (*(uint *)paVar5 == 0) {
      *(uint *)paVar5 = uVar4;
      goto LAB_001a71fb;
    }
    if (*(uint *)paVar5 != 0x22) goto LAB_001a71fb;
    std::__throw_out_of_range("stoul");
  }
  uVar8 = (ulong)(reportMetadata->reportTime).super__Optional_base<metaf::MetafTime,_true,_true>.
                 _M_payload.super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.
                 hourValue;
LAB_001a71fb:
  local_80 = uVar8;
  pWVar1 = local_a8;
  if ((sVar11 != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2)) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::str(&local_a0,&local_78,4);
  _Var13._M_p = local_a0._M_dataplus._M_p;
  piVar6 = __errno_location();
  iVar3 = *piVar6;
  *piVar6 = 0;
  uVar8 = strtoul(_Var13._M_p,&local_58,10);
  if (local_58 == _Var13._M_p) {
    std::__throw_invalid_argument("stoul");
LAB_001a73e2:
    uVar7 = std::__throw_invalid_argument("stoul");
    __cxa_guard_abort(&appendPeakWind(std::__cxx11::string_const&,metaf::ReportMetadata_const&)::
                       pkWndRgx_abi_cxx11_);
    _Unwind_Resume(uVar7);
  }
  if (*piVar6 == 0) {
LAB_001a72a0:
    *piVar6 = iVar3;
  }
  else if (*piVar6 == 0x22) {
    std::__throw_out_of_range("stoul");
    goto LAB_001a72a0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  *(undefined1 *)
   ((long)&(pWVar1->evTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MetafTime>._M_payload + 4) = 0;
  (pWVar1->evTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.hourValue = (uint)local_80;
  (pWVar1->evTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.minuteValue = (uint)uVar8;
  if ((pWVar1->evTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::MetafTime>._M_engaged == false) {
    (pWVar1->evTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
    super__Optional_payload_base<metaf::MetafTime>._M_engaged = true;
  }
  pWVar1->incompleteText = NONE;
  AVar10 = APPENDED;
LAB_001a72e2:
  if (local_78.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return AVar10;
}

Assistant:

AppendResult WindGroup::appendPeakWind(const std::string & group,
	const ReportMetadata & reportMetadata)
{

	static const std::regex pkWndRgx("(\\d\\d0)([1-9]?\\d\\d)/(\\d\\d)?(\\d\\d)");
	static const auto matchDir = 1, matchSpeed = 2;
	static const auto matchHour = 3, matchMinute = 4;

	std::smatch match;
	if (!std::regex_match(group, match, pkWndRgx)) return AppendResult::GROUP_INVALIDATED;

	windType = Type::PEAK_WIND;
	const auto dir = Direction::fromDegreesString(match.str(matchDir));
	if (!dir.has_value()) return AppendResult::GROUP_INVALIDATED;
	windDir = *dir;

	const auto speed =
		Speed::fromString(match.str(matchSpeed), Speed::Unit::KNOTS);
	if (!speed.has_value()) return AppendResult::GROUP_INVALIDATED;
	wSpeed = *speed;

	if (!reportMetadata.reportTime.has_value() && match.str(matchHour).empty()) {
		return AppendResult::GROUP_INVALIDATED;
	}
	const unsigned int hour = match.str(matchHour).empty() ?
		reportMetadata.reportTime->hour() : (unsigned int)stoul(match.str(matchHour));
	const unsigned int minute = (unsigned int)stoul(match.str(matchMinute));
	evTime = MetafTime(hour, minute);
	incompleteText = IncompleteText::NONE;

	return AppendResult::APPENDED;
}